

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-filter-tokens.cc
# Opt level: O3

int main(int argc,char **argv)

{
  ColorToGray *__p;
  undefined8 extraout_RAX;
  long *plVar1;
  ostream *poVar2;
  char *pcVar3;
  int extraout_EDX;
  long lVar4;
  QPDF pdf;
  QPDFWriter w;
  QPDF aQStack_98 [8];
  ColorToGray *local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  StringReverser *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  undefined1 local_70 [32];
  char *local_50;
  long local_48;
  long local_40;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  if (argc == 3) {
    pcVar3 = argv[1];
    local_50 = argv[2];
    QPDF::QPDF(aQStack_98);
    QPDF::processFile((char *)aQStack_98,pcVar3);
    QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_70,aQStack_98);
    QPDFPageDocumentHelper::getAllPages();
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_70);
    if (local_48 != local_40) {
      lVar4 = local_48;
      do {
        local_80 = (StringReverser *)operator_new(0x10);
        *(undefined ***)local_80 = &PTR__TokenFilter_00106c10;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<StringReverser*>
                  (&local_78,local_80);
        QPDFPageObjectHelper::addContentTokenFilter(lVar4);
        if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
        }
        __p = (ColorToGray *)operator_new(0xb0);
        *(undefined ***)__p = &PTR__ColorToGray_00106c58;
        (__p->all_stack).
        super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>._M_impl.
        super__Deque_impl_data._M_map = (_Map_pointer)0x0;
        (__p->all_stack).
        super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>._M_impl.
        super__Deque_impl_data._M_map_size = 0;
        (__p->all_stack).
        super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
        (__p->all_stack).
        super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>._M_impl.
        super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
        (__p->all_stack).
        super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>._M_impl.
        super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
        (__p->all_stack).
        super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>._M_impl.
        super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
        (__p->all_stack).
        super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
        (__p->all_stack).
        super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
        (__p->all_stack).
        super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>._M_impl.
        super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
        (__p->all_stack).
        super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>._M_impl.
        super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
        std::_Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::
        _M_initialize_map(&(__p->all_stack).
                           super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>
                          ,0);
        (__p->stack).super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
        (__p->stack).super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
        (__p->stack).super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
        (__p->stack).super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
        (__p->stack).super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>.
        _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
        (__p->stack).super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>.
        _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
        (__p->stack).super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>.
        _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
        (__p->stack).super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>.
        _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
        (__p->stack).super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>.
        _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
        (__p->stack).super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>.
        _M_impl.super__Deque_impl_data._M_map_size = 0;
        std::_Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::
        _M_initialize_map(&(__p->stack).
                           super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>
                          ,0);
        local_90 = __p;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ColorToGray*>(&local_88,__p)
        ;
        QPDFPageObjectHelper::addContentTokenFilter(lVar4,&local_90);
        if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
        }
        lVar4 = lVar4 + 0x38;
      } while (lVar4 != local_40);
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_48);
    QPDFWriter::QPDFWriter((QPDFWriter *)local_70,aQStack_98,local_50);
    QPDFWriter::setStaticID(SUB81(local_70,0));
    QPDFWriter::setQDFMode(SUB81(local_70,0));
    QPDFWriter::write();
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
    }
    QPDF::~QPDF(aQStack_98);
    return 0;
  }
  usage();
  QPDF::~QPDF(aQStack_98);
  if (extraout_EDX == 1) {
    plVar1 = (long *)__cxa_begin_catch(extraout_RAX);
    poVar2 = std::operator<<((ostream *)&std::cerr,whoami);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
    pcVar3 = (char *)(**(code **)(*plVar1 + 0x10))(plVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    exit(2);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    if (argc != 3) {
        usage();
    }
    char const* infilename = argv[1];
    char const* outfilename = argv[2];

    try {
        QPDF pdf;
        pdf.processFile(infilename);
        for (auto& page: QPDFPageDocumentHelper(pdf).getAllPages()) {
            // Attach two token filters to each page of this file. When the file is written, or when
            // the pages' contents are retrieved in any other way, the filters will be applied. See
            // comments on the filters for additional details.
            page.addContentTokenFilter(
                std::shared_ptr<QPDFObjectHandle::TokenFilter>(new StringReverser));
            page.addContentTokenFilter(
                std::shared_ptr<QPDFObjectHandle::TokenFilter>(new ColorToGray));
        }

        QPDFWriter w(pdf, outfilename);
        w.setStaticID(true); // for testing only
        w.setQDFMode(true);
        w.write();
    } catch (std::exception& e) {
        std::cerr << whoami << ": " << e.what() << std::endl;
        exit(2);
    }

    return 0;
}